

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O1

void __thiscall QErrorMessage::~QErrorMessage(QErrorMessage *this)

{
  undefined1 *this_00;
  
  this_00 = &this[-1].super_QDialog.super_QWidget.field_0x18;
  ~QErrorMessage((QErrorMessage *)this_00);
  operator_delete(this_00,0x28);
  return;
}

Assistant:

QErrorMessage::~QErrorMessage()
{
    if (this == qtMessageHandler) {
        qtMessageHandler = nullptr;
        QtMessageHandler currentMessagHandler = qInstallMessageHandler(nullptr);
        if (currentMessagHandler != jump)
            qInstallMessageHandler(currentMessagHandler);
        else
            qInstallMessageHandler(originalMessageHandler);
        originalMessageHandler = nullptr;
    }
}